

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trust_token.cc
# Opt level: O3

int TRUST_TOKEN_ISSUER_issue
              (TRUST_TOKEN_ISSUER *ctx,uint8_t **out,size_t *out_len,size_t *out_tokens_issued,
              uint8_t *request,size_t request_len,uint32_t public_metadata,uint8_t private_metadata,
              size_t max_issuance)

{
  ulong uVar1;
  int iVar2;
  size_t sVar3;
  TRUST_TOKEN_ISSUER_KEY *pTVar4;
  int iVar5;
  uint16_t num_requested;
  CBB response;
  ushort local_82;
  ulong local_80;
  size_t *local_78;
  CBS local_70;
  CBB local_60;
  
  if (ctx->max_batchsize < max_issuance) {
    max_issuance = (ulong)ctx->max_batchsize;
  }
  sVar3 = ctx->num_keys;
  if (sVar3 != 0) {
    pTVar4 = (TRUST_TOKEN_ISSUER_KEY *)ctx->keys;
    do {
      pTVar4 = (TRUST_TOKEN_ISSUER_KEY *)((pTVar4->x0).words + 1);
      if (*(uint32_t *)((long)&pTVar4[-1].pubs_precomp + 0x1168) == public_metadata) {
        if ((private_metadata < 2) &&
           ((private_metadata == '\0' || (ctx->method->has_private_metadata != 0)))) {
          local_78 = out_tokens_issued;
          local_70.data = request;
          local_70.len = request_len;
          iVar2 = CBS_get_u16(&local_70,&local_82);
          if (iVar2 != 0) {
            local_80 = (ulong)local_82;
            if (max_issuance < local_82) {
              local_80 = max_issuance;
            }
            iVar5 = 0;
            iVar2 = CBB_init(&local_60,0);
            if (iVar2 != 0) {
              iVar2 = CBB_add_u16(&local_60,(uint16_t)local_80);
              if (((iVar2 != 0) &&
                  (iVar2 = CBB_add_u32(&local_60,public_metadata), uVar1 = local_80, iVar2 != 0)) &&
                 (iVar2 = (*ctx->method->sign)
                                    (pTVar4,&local_60,&local_70,(size_t)local_82,local_80,
                                     private_metadata), iVar2 != 0)) {
                if (local_70.len == 0) {
                  iVar2 = CBB_finish(&local_60,out,out_len);
                  if (iVar2 != 0) {
                    *local_78 = uVar1;
                    iVar5 = 1;
                  }
                }
                else {
                  iVar5 = 0;
                  ERR_put_error(0x20,0,0x69,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/trust_token/trust_token.cc"
                                ,0x232);
                }
              }
            }
            CBB_cleanup(&local_60);
            return iVar5;
          }
          iVar2 = 0x69;
          iVar5 = 0x21c;
          goto LAB_001a403f;
        }
        break;
      }
      pTVar4 = pTVar4 + 1;
      sVar3 = sVar3 - 1;
    } while (sVar3 != 0);
  }
  iVar2 = 0x6a;
  iVar5 = 0x214;
LAB_001a403f:
  ERR_put_error(0x20,0,iVar2,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/trust_token/trust_token.cc"
                ,iVar5);
  return 0;
}

Assistant:

int TRUST_TOKEN_ISSUER_issue(const TRUST_TOKEN_ISSUER *ctx, uint8_t **out,
                             size_t *out_len, size_t *out_tokens_issued,
                             const uint8_t *request, size_t request_len,
                             uint32_t public_metadata, uint8_t private_metadata,
                             size_t max_issuance) {
  if (max_issuance > ctx->max_batchsize) {
    max_issuance = ctx->max_batchsize;
  }

  const struct trust_token_issuer_key_st *key =
      trust_token_issuer_get_key(ctx, public_metadata);
  if (key == NULL || private_metadata > 1 ||
      (!ctx->method->has_private_metadata && private_metadata != 0)) {
    OPENSSL_PUT_ERROR(TRUST_TOKEN, TRUST_TOKEN_R_INVALID_METADATA);
    return 0;
  }

  CBS in;
  uint16_t num_requested;
  CBS_init(&in, request, request_len);
  if (!CBS_get_u16(&in, &num_requested)) {
    OPENSSL_PUT_ERROR(TRUST_TOKEN, TRUST_TOKEN_R_DECODE_FAILURE);
    return 0;
  }

  size_t num_to_issue = num_requested;
  if (num_to_issue > max_issuance) {
    num_to_issue = max_issuance;
  }

  int ret = 0;
  CBB response;
  if (!CBB_init(&response, 0) || !CBB_add_u16(&response, num_to_issue) ||
      !CBB_add_u32(&response, public_metadata)) {
    goto err;
  }

  if (!ctx->method->sign(&key->key, &response, &in, num_requested, num_to_issue,
                         private_metadata)) {
    goto err;
  }

  if (CBS_len(&in) != 0) {
    OPENSSL_PUT_ERROR(TRUST_TOKEN, TRUST_TOKEN_R_DECODE_FAILURE);
    goto err;
  }

  if (!CBB_finish(&response, out, out_len)) {
    goto err;
  }

  *out_tokens_issued = num_to_issue;
  ret = 1;

err:
  CBB_cleanup(&response);
  return ret;
}